

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int validate_length_range
              (uint8_t kind,uint64_t unum,int64_t snum,int64_t fnum,uint8_t fnum_dig,lys_type *type,
              char *val_str,lyd_node *node)

{
  LY_DATA_TYPE LVar1;
  ly_ctx *ctx;
  lys_restr *plVar2;
  bool bVar3;
  bool bVar4;
  lys_type *plVar5;
  int iVar6;
  lys_type *plVar7;
  uint uVar8;
  undefined7 in_register_00000039;
  char *pcVar9;
  undefined8 uVar10;
  len_ran_intv *plVar11;
  uint uVar12;
  len_ran_intv *local_40;
  len_ran_intv *intv;
  
  local_40 = (len_ran_intv *)0x0;
  ctx = type->parent->module->ctx;
  iVar6 = resolve_len_ran_interval(ctx,(char *)0x0,type,&local_40);
  if (iVar6 == 0) {
    uVar12 = (uint)CONCAT71(in_register_00000039,kind);
    if (local_40 == (len_ran_intv *)0x0) {
      return 0;
    }
    intv._0_4_ = uVar12 & 0xff;
    plVar5 = local_40->type;
    plVar11 = local_40;
    intv._4_4_ = uVar12;
    uVar8 = (uint)intv;
    do {
      plVar7 = plVar5;
      bVar3 = false;
      while (plVar11->type == plVar7) {
        bVar4 = false;
        if (bVar3) {
LAB_00125db3:
          bVar4 = false;
          bVar3 = true;
        }
        else if ((char)uVar12 == '\x02') {
          iVar6 = dec64cmp(fnum,fnum_dig,(plVar11->value).sval.min,(plVar7->info).dec64.dig);
          if (iVar6 < 0) goto LAB_00125e7d;
          iVar6 = dec64cmp(fnum,fnum_dig,(plVar11->value).sval.min,(plVar7->info).dec64.dig);
          bVar4 = true;
          uVar12 = intv._4_4_;
          uVar8 = (uint)intv;
          bVar3 = false;
          if ((-1 < iVar6) &&
             (iVar6 = dec64cmp(fnum,fnum_dig,(plVar11->value).sval.max,(plVar7->info).dec64.dig),
             uVar12 = intv._4_4_, uVar8 = (uint)intv, iVar6 < 1)) goto LAB_00125db3;
        }
        else {
          bVar3 = bVar4;
          if (uVar8 == 1) {
            if (snum < (plVar11->value).sval.min) goto LAB_00125e7d;
            bVar4 = true;
            if (snum <= (plVar11->value).sval.max) goto LAB_00125db3;
          }
          else {
            bVar4 = true;
            if (uVar8 == 0) {
              if (unum < (plVar11->value).uval.min) goto LAB_00125e7d;
              bVar4 = true;
              if (unum <= (plVar11->value).uval.max) goto LAB_00125db3;
            }
          }
        }
        plVar11 = plVar11->next;
        if (plVar11 == (len_ran_intv *)0x0) goto joined_r0x00125e87;
      }
      plVar5 = plVar11->type;
    } while (bVar3);
LAB_00125e7d:
    bVar4 = true;
joined_r0x00125e87:
    while (local_40 != (len_ran_intv *)0x0) {
      plVar11 = local_40->next;
      free(local_40);
      local_40 = plVar11;
    }
    if (!bVar4) {
      return 0;
    }
    LVar1 = plVar7->base;
    if ((LVar1 - LY_TYPE_INT8 < 8) ||
       ((LVar1 < LY_TYPE_UNION && ((0x412U >> (LVar1 & (LY_TYPE_INT32|LY_TYPE_UINT16)) & 1) != 0))))
    {
      plVar2 = (plVar7->info).dec64.range;
      pcVar9 = "";
      if (val_str != (char *)0x0) {
        pcVar9 = val_str;
      }
      if (plVar2 == (lys_restr *)0x0) {
        ly_vlog(ctx,LYE_NOCONSTR,LY_VLOG_LYD,node,pcVar9,"");
        return 1;
      }
      ly_vlog(ctx,LYE_NOCONSTR,LY_VLOG_LYD,node,pcVar9,plVar2->expr);
      if (plVar2->emsg != (char *)0x0) {
        ly_vlog_str(ctx,LY_VLOG_PREV,plVar2->emsg);
      }
      if (plVar2->eapptag != (char *)0x0) {
        ly_err_last_set_apptag(ctx,plVar2->eapptag);
        return 1;
      }
      return 1;
    }
    uVar10 = 0x249;
    local_40 = (len_ran_intv *)0x0;
  }
  else {
    uVar10 = 0x206;
  }
  ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
         ,uVar10);
  return 1;
}

Assistant:

static int
validate_length_range(uint8_t kind, uint64_t unum, int64_t snum, int64_t fnum, uint8_t fnum_dig, struct lys_type *type,
                      const char *val_str, struct lyd_node *node)
{
    struct lys_restr *restr = NULL;
    struct len_ran_intv *intv = NULL, *tmp_intv;
    struct lys_type *cur_type;
    struct ly_ctx *ctx = type->parent->module->ctx;
    int match;

    if (resolve_len_ran_interval(ctx, NULL, type, &intv)) {
        /* already done during schema parsing */
        LOGINT(ctx);
        return EXIT_FAILURE;
    }
    if (!intv) {
        return EXIT_SUCCESS;
    }

    /* I know that all intervals belonging to a single restriction share one type pointer */
    tmp_intv = intv;
    cur_type = intv->type;
    do {
        match = 0;
        for (; tmp_intv && (tmp_intv->type == cur_type); tmp_intv = tmp_intv->next) {
            if (match) {
                /* just iterate through the rest of this restriction intervals */
                continue;
            }

            if (((kind == 0) && (unum < tmp_intv->value.uval.min))
                    || ((kind == 1) && (snum < tmp_intv->value.sval.min))
                    || ((kind == 2) && (dec64cmp(fnum, fnum_dig, tmp_intv->value.fval.min, cur_type->info.dec64.dig) < 0))) {
                break;
            }

            if (((kind == 0) && (unum >= tmp_intv->value.uval.min) && (unum <= tmp_intv->value.uval.max))
                    || ((kind == 1) && (snum >= tmp_intv->value.sval.min) && (snum <= tmp_intv->value.sval.max))
                    || ((kind == 2) && (dec64cmp(fnum, fnum_dig, tmp_intv->value.fval.min, cur_type->info.dec64.dig) > -1)
                    && (dec64cmp(fnum, fnum_dig, tmp_intv->value.fval.max, cur_type->info.dec64.dig) < 1))) {
                match = 1;
            }
        }

        if (!match) {
            break;
        } else if (tmp_intv) {
            cur_type = tmp_intv->type;
        }
    } while (tmp_intv);

    while (intv) {
        tmp_intv = intv->next;
        free(intv);
        intv = tmp_intv;
    }

    if (!match) {
        switch (cur_type->base) {
        case LY_TYPE_BINARY:
            restr = cur_type->info.binary.length;
            break;
        case LY_TYPE_DEC64:
            restr = cur_type->info.dec64.range;
            break;
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
            restr = cur_type->info.num.range;
            break;
        case LY_TYPE_STRING:
            restr = cur_type->info.str.length;
            break;
        default:
            LOGINT(ctx);
            return EXIT_FAILURE;
        }

        LOGVAL(ctx, LYE_NOCONSTR, LY_VLOG_LYD, node, (val_str ? val_str : ""), restr ? restr->expr : "");
        if (restr && restr->emsg) {
            ly_vlog_str(ctx, LY_VLOG_PREV, restr->emsg);
        }
        if (restr && restr->eapptag) {
            ly_err_last_set_apptag(ctx, restr->eapptag);
        }
        return EXIT_FAILURE;
    }
    return EXIT_SUCCESS;
}